

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

void __thiscall HPresolve::rowDualBoundsDominatedColumns(HPresolve *this)

{
  double dVar1;
  bool bVar2;
  reference pvVar3;
  reference piVar4;
  ostream *poVar5;
  reference pvVar6;
  double dVar7;
  iterator it;
  int k;
  int i;
  int col;
  list<int,_std::allocator<int>_> *in_stack_fffffffffffffef8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff00;
  double in_stack_ffffffffffffff30;
  HPresolve *in_stack_ffffffffffffff38;
  _Self local_28;
  _Self local_20;
  int local_14;
  value_type local_10;
  int local_c;
  
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::list<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffef8);
  do {
    local_28._M_node =
         (_List_node_base *)
         std::__cxx11::list<int,_std::allocator<int>_>::end(in_stack_fffffffffffffef8);
    bVar2 = std::operator!=(&local_20,&local_28);
    if (!bVar2) {
      return;
    }
    std::_List_iterator<int>::operator*((_List_iterator<int> *)0x19deb0);
    pvVar3 = std::vector<int,_std::allocator<int>_>::at
                       ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff00,
                        (size_type)in_stack_fffffffffffffef8);
    if (*pvVar3 != 0) {
      piVar4 = std::_List_iterator<int>::operator*((_List_iterator<int> *)0x19ded6);
      local_c = *piVar4;
      local_14 = getSingColElementIndexInA
                           (in_stack_ffffffffffffff38,
                            (int)((ulong)in_stack_ffffffffffffff30 >> 0x20));
      pvVar3 = std::vector<int,_std::allocator<int>_>::at
                         ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff00,
                          (size_type)in_stack_fffffffffffffef8);
      local_10 = *pvVar3;
      pvVar3 = std::vector<int,_std::allocator<int>_>::at
                         ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff00,
                          (size_type)in_stack_fffffffffffffef8);
      if (*pvVar3 == 0) {
        poVar5 = std::operator<<((ostream *)&std::cout,"ERROR: column singleton ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_c);
        poVar5 = std::operator<<(poVar5," is in row ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_10);
        std::operator<<(poVar5," which is already mapped off\n");
        exit(-1);
      }
      pvVar6 = std::vector<double,_std::allocator<double>_>::at
                         (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
      if ((*pvVar6 != -1e+200) || (NAN(*pvVar6))) {
        pvVar6 = std::vector<double,_std::allocator<double>_>::at
                           (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
        if ((*pvVar6 != 1e+200) || (NAN(*pvVar6))) goto LAB_0019e86a;
      }
      pvVar6 = std::vector<double,_std::allocator<double>_>::at
                         (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
      if (*pvVar6 <= -1e+200) {
LAB_0019e2bd:
        pvVar6 = std::vector<double,_std::allocator<double>_>::at
                           (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
        if ((*pvVar6 != -1e+200) ||
           ((NAN(*pvVar6) ||
            (pvVar6 = std::vector<double,_std::allocator<double>_>::at
                                (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8),
            1e+200 < *pvVar6 || *pvVar6 == 1e+200)))) {
          pvVar6 = std::vector<double,_std::allocator<double>_>::at
                             (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
          if ((*pvVar6 == -1e+200) && (!NAN(*pvVar6))) {
            pvVar6 = std::vector<double,_std::allocator<double>_>::at
                               (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
            if ((*pvVar6 == 1e+200) && (!NAN(*pvVar6))) {
              pvVar6 = std::vector<double,_std::allocator<double>_>::at
                                 (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
              in_stack_ffffffffffffff38 = (HPresolve *)*pvVar6;
              pvVar6 = std::vector<double,_std::allocator<double>_>::at
                                 (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
              dVar7 = (double)in_stack_ffffffffffffff38 / *pvVar6;
              pvVar6 = std::vector<double,_std::allocator<double>_>::at
                                 (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
              if (*pvVar6 <= dVar7 && dVar7 != *pvVar6) {
                pvVar6 = std::vector<double,_std::allocator<double>_>::at
                                   (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
                in_stack_ffffffffffffff30 = *pvVar6;
                pvVar6 = std::vector<double,_std::allocator<double>_>::at
                                   (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
                in_stack_ffffffffffffff30 = in_stack_ffffffffffffff30 / *pvVar6;
                pvVar6 = std::vector<double,_std::allocator<double>_>::at
                                   (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
                *pvVar6 = in_stack_ffffffffffffff30;
              }
              pvVar6 = std::vector<double,_std::allocator<double>_>::at
                                 (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
              dVar7 = *pvVar6;
              pvVar6 = std::vector<double,_std::allocator<double>_>::at
                                 (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
              dVar1 = *pvVar6;
              pvVar6 = std::vector<double,_std::allocator<double>_>::at
                                 (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
              if (dVar7 / dVar1 < *pvVar6) {
                pvVar6 = std::vector<double,_std::allocator<double>_>::at
                                   (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
                dVar7 = *pvVar6;
                pvVar6 = std::vector<double,_std::allocator<double>_>::at
                                   (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
                dVar1 = *pvVar6;
                pvVar6 = std::vector<double,_std::allocator<double>_>::at
                                   (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
                *pvVar6 = dVar7 / dVar1;
              }
            }
          }
        }
        else {
          pvVar6 = std::vector<double,_std::allocator<double>_>::at
                             (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
          if (0.0 < *pvVar6) {
            pvVar6 = std::vector<double,_std::allocator<double>_>::at
                               (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
            dVar7 = *pvVar6;
            pvVar6 = std::vector<double,_std::allocator<double>_>::at
                               (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
            dVar1 = *pvVar6;
            pvVar6 = std::vector<double,_std::allocator<double>_>::at
                               (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
            if (*pvVar6 <= dVar7 / dVar1 && dVar7 / dVar1 != *pvVar6) {
              pvVar6 = std::vector<double,_std::allocator<double>_>::at
                                 (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
              dVar7 = *pvVar6;
              pvVar6 = std::vector<double,_std::allocator<double>_>::at
                                 (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
              dVar1 = *pvVar6;
              pvVar6 = std::vector<double,_std::allocator<double>_>::at
                                 (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
              *pvVar6 = -dVar7 / dVar1;
            }
          }
          pvVar6 = std::vector<double,_std::allocator<double>_>::at
                             (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
          if (*pvVar6 <= 0.0 && *pvVar6 != 0.0) {
            pvVar6 = std::vector<double,_std::allocator<double>_>::at
                               (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
            dVar7 = *pvVar6;
            pvVar6 = std::vector<double,_std::allocator<double>_>::at
                               (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
            dVar1 = *pvVar6;
            pvVar6 = std::vector<double,_std::allocator<double>_>::at
                               (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
            if (dVar7 / dVar1 < *pvVar6) {
              pvVar6 = std::vector<double,_std::allocator<double>_>::at
                                 (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
              dVar7 = *pvVar6;
              pvVar6 = std::vector<double,_std::allocator<double>_>::at
                                 (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
              dVar1 = *pvVar6;
              pvVar6 = std::vector<double,_std::allocator<double>_>::at
                                 (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
              *pvVar6 = dVar7 / dVar1;
            }
          }
        }
      }
      else {
        pvVar6 = std::vector<double,_std::allocator<double>_>::at
                           (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
        if ((*pvVar6 != 1e+200) || (NAN(*pvVar6))) goto LAB_0019e2bd;
        pvVar6 = std::vector<double,_std::allocator<double>_>::at
                           (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
        if (0.0 < *pvVar6) {
          pvVar6 = std::vector<double,_std::allocator<double>_>::at
                             (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
          dVar7 = *pvVar6;
          pvVar6 = std::vector<double,_std::allocator<double>_>::at
                             (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
          dVar1 = *pvVar6;
          pvVar6 = std::vector<double,_std::allocator<double>_>::at
                             (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
          if (dVar7 / dVar1 < *pvVar6) {
            pvVar6 = std::vector<double,_std::allocator<double>_>::at
                               (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
            dVar7 = *pvVar6;
            pvVar6 = std::vector<double,_std::allocator<double>_>::at
                               (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
            dVar1 = *pvVar6;
            pvVar6 = std::vector<double,_std::allocator<double>_>::at
                               (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
            *pvVar6 = dVar7 / dVar1;
          }
        }
        pvVar6 = std::vector<double,_std::allocator<double>_>::at
                           (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
        if (*pvVar6 <= 0.0 && *pvVar6 != 0.0) {
          pvVar6 = std::vector<double,_std::allocator<double>_>::at
                             (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
          dVar7 = *pvVar6;
          pvVar6 = std::vector<double,_std::allocator<double>_>::at
                             (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
          dVar1 = *pvVar6;
          pvVar6 = std::vector<double,_std::allocator<double>_>::at
                             (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
          if (*pvVar6 <= dVar7 / dVar1 && dVar7 / dVar1 != *pvVar6) {
            pvVar6 = std::vector<double,_std::allocator<double>_>::at
                               (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
            dVar7 = *pvVar6;
            pvVar6 = std::vector<double,_std::allocator<double>_>::at
                               (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
            dVar1 = *pvVar6;
            pvVar6 = std::vector<double,_std::allocator<double>_>::at
                               (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
            *pvVar6 = dVar7 / dVar1;
          }
        }
      }
      pvVar6 = std::vector<double,_std::allocator<double>_>::at
                         (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
      in_stack_ffffffffffffff00 = (vector<double,_std::allocator<double>_> *)*pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::at
                         (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
      if (*pvVar6 <= (double)in_stack_ffffffffffffff00 &&
          (double)in_stack_ffffffffffffff00 != *pvVar6) {
        poVar5 = std::operator<<((ostream *)&std::cout,
                                 "Error: inconstistent bounds for Lagrange multiplier for row ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_10);
        poVar5 = std::operator<<(poVar5," detected after column singleton ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_c);
        poVar5 = std::operator<<(poVar5,". In presolve::dominatedColumns");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        exit(0);
      }
    }
LAB_0019e86a:
    std::_List_iterator<int>::operator++(&local_20);
  } while( true );
}

Assistant:

void HPresolve::rowDualBoundsDominatedColumns() {
	int col, i, k;

	//for each row calc yihat and yibar and store in implRowDualLower and implRowDualUpper
	for (list<int>::iterator it = singCol.begin(); it != singCol.end(); ++it)
		if (flagCol.at(*it)) {
			col = *it;
			k = getSingColElementIndexInA(col);
			i = Aindex.at(k);

			if (!flagRow.at(i)) {
				cout<<"ERROR: column singleton "<<col<<" is in row "<<i<<" which is already mapped off\n";
				exit(-1);
			}

			if (colLower.at(col) == -HSOL_CONST_INF || colUpper.at(col) == HSOL_CONST_INF) {

				if (colLower.at(col) > -HSOL_CONST_INF && colUpper.at(col) == HSOL_CONST_INF)  {
					if (Avalue.at(k)>0)
						if ((colCost.at(col)/Avalue.at(k)) < implRowDualUpper.at(i))
							implRowDualUpper.at(i) = colCost.at(col)/Avalue.at(k);
					if (Avalue.at(k)<0)
						if ((colCost.at(col)/Avalue.at(k)) > implRowDualLower.at(i))
							implRowDualLower.at(i) = colCost.at(col)/Avalue.at(k);
				}
				else if (colLower.at(col) == -HSOL_CONST_INF && colUpper.at(col) < HSOL_CONST_INF) {
					if (Avalue.at(k)>0)
						if ((colCost.at(col)/Avalue.at(k)) > implRowDualLower.at(i))
							implRowDualUpper.at(i) = -colCost.at(col)/Avalue.at(k);
					if (Avalue.at(k)<0)
						if ((colCost.at(col)/Avalue.at(k)) < implRowDualUpper.at(i))
							implRowDualUpper.at(i) = colCost.at(col)/Avalue.at(k);
				}
				else if (colLower.at(col) == -HSOL_CONST_INF && colUpper.at(col) == HSOL_CONST_INF) {
					//all should be removed earlier but use them
					if ((colCost.at(col)/Avalue.at(k)) > implRowDualLower.at(i))
							implRowDualLower.at(i) = colCost.at(col)/Avalue.at(k);
					if ((colCost.at(col)/Avalue.at(k)) < implRowDualUpper.at(i))
							implRowDualUpper.at(i) = colCost.at(col)/Avalue.at(k);
				}

				if (implRowDualLower.at(i) > implRowDualUpper.at(i)) {
					cout<<"Error: inconstistent bounds for Lagrange multiplier for row "<< i<< " detected after column singleton "<<col<<". In presolve::dominatedColumns"<<endl;
					exit(0);
				}
			}
		}

}